

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O3

void __thiscall sznet::net::TcpConnection::handleRead(TcpConnection *this,Timestamp receiveTime)

{
  Buffer *this_00;
  EventLoop *this_01;
  bool bVar1;
  sz_ssize_t sVar2;
  undefined8 uVar3;
  SourceFile file;
  undefined1 local_1010 [4016];
  char *local_60 [4];
  Timestamp local_40;
  Buffer *local_38;
  int local_2c [2];
  int savedErrno;
  
  this_01 = this->m_loop;
  bVar1 = EventLoop::isInLoopThread(this_01);
  if (!bVar1) {
    EventLoop::abortNotInLoopThread(this_01);
  }
  this_00 = &this->m_inputBuffer;
  local_2c[0] = 0;
LAB_0011d29d:
  sVar2 = Buffer::readvFd(this_00,((this->m_channel)._M_t.
                                   super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                                   .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl
                                  )->m_fd,local_2c);
  if (sVar2 == -1) goto code_r0x0011d2b5;
  goto LAB_0011d2bb;
code_r0x0011d2b5:
  if (local_2c[0] != 4) {
LAB_0011d2bb:
    if (sVar2 < 1) {
      if (sVar2 == 0) {
        handleClose(this);
      }
      else {
        bVar1 = sockets::sz_wouldblock();
        if (!bVar1) {
          file._8_8_ = 0x11;
          file.m_data = "TcpConnection.cpp";
          Logger::Logger((Logger *)local_1010,file,0x158,false);
          if (0x19 < (uint)((int)local_60 - (int)local_60[0])) {
            builtin_strncpy(local_60[0],"TcpConnection::handleRead",0x19);
            local_60[0] = local_60[0] + 0x19;
          }
          Logger::~Logger((Logger *)local_1010);
          handleError(this);
          handleClose(this);
        }
        std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<sznet::net::TcpConnection,void>
                  ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)local_1010,
                   (__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
        local_40.m_microSecondsSinceEpoch = receiveTime.m_microSecondsSinceEpoch;
        local_38 = this_00;
        if ((this->m_messageCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
          uVar3 = std::__throw_bad_function_call();
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1010._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1010._8_8_);
          }
          _Unwind_Resume(uVar3);
        }
        (*(this->m_messageCallback)._M_invoker)
                  ((_Any_data *)&this->m_messageCallback,
                   (shared_ptr<sznet::net::TcpConnection> *)local_1010,&local_38,&local_40);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1010._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1010._8_8_);
        }
      }
      return;
    }
    (this->m_netStatInfo).m_recvBytes = (this->m_netStatInfo).m_recvBytes + sVar2;
  }
  goto LAB_0011d29d;
}

Assistant:

void TcpConnection::handleRead(Timestamp receiveTime)
{
	m_loop->assertInLoopThread();
	int savedErrno = 0;
	sz_ssize_t n = 0;
	while (true)
	{
		do
		{
			n = m_inputBuffer.readvFd(m_channel->fd(), &savedErrno);
		} while (n == -1 && savedErrno == sz_err_eintr);
		if (n > 0)
		{
			m_netStatInfo.m_recvBytes += n;
		}
		else if (n == 0)
		{
			handleClose();
			return;
		}
		else
		{
			if (!sockets::sz_wouldblock())
			{
				LOG_SYSERR << "TcpConnection::handleRead";
				handleError();
				handleClose();
			}
			// ����ȫ����ȡ����
			break;
		}
	}
	// ��������
	m_messageCallback(shared_from_this(), &m_inputBuffer, receiveTime);
}